

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-default-loop-close.c
# Opt level: O0

int run_test_default_loop_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_a8 [8];
  uv_timer_t timer_handle;
  uv_loop_t *loop;
  
  timer_handle.start_id = (uint64_t)uv_default_loop();
  if ((uv_loop_t *)timer_handle.start_id == (uv_loop_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x28,"loop != NULL");
    abort();
  }
  iVar1 = uv_timer_init((uv_loop_t *)timer_handle.start_id,(uv_timer_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x2a,"0 == uv_timer_init(loop, &timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)local_a8,timer_cb,1,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x2b,"0 == uv_timer_start(&timer_handle, timer_cb, 1, 0)");
    abort();
  }
  iVar1 = uv_run((uv_loop_t *)timer_handle.start_id,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x2c,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x2d,"1 == timer_cb_called");
    abort();
  }
  iVar1 = uv_loop_close((uv_loop_t *)timer_handle.start_id);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x2e,"0 == uv_loop_close(loop)");
    abort();
  }
  timer_handle.start_id = (uint64_t)uv_default_loop();
  if ((uv_loop_t *)timer_handle.start_id == (uv_loop_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x31,"loop != NULL");
    abort();
  }
  iVar1 = uv_timer_init((uv_loop_t *)timer_handle.start_id,(uv_timer_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x33,"0 == uv_timer_init(loop, &timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)local_a8,timer_cb,1,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x34,"0 == uv_timer_start(&timer_handle, timer_cb, 1, 0)");
    abort();
  }
  iVar1 = uv_run((uv_loop_t *)timer_handle.start_id,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x35,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (timer_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x36,"2 == timer_cb_called");
    abort();
  }
  iVar1 = uv_loop_close((uv_loop_t *)timer_handle.start_id);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x37,"0 == uv_loop_close(loop)");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
            ,0x39,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(default_loop_close) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}